

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O0

Collision * __thiscall
Sphere::collide(Collision *__return_storage_ptr__,Sphere *this,Vector3 *start,Vector3 *dir)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Vector3 local_108;
  Vector3 local_f0;
  undefined1 local_d8 [8];
  Vector3 p_1;
  Vector3 local_a8;
  undefined1 local_90 [8];
  Vector3 p;
  double t2;
  double t1;
  double thc;
  double thc2;
  double tca;
  Vector3 oc;
  Vector3 d;
  Vector3 *dir_local;
  Vector3 *start_local;
  Sphere *this_local;
  
  Vector3::unitize((Vector3 *)&oc.z,dir);
  operator-((Vector3 *)&tca,&this->m_o,start);
  dVar1 = Vector3::dot((Vector3 *)&tca,(Vector3 *)&oc.z);
  if (1e-06 < dVar1) {
    dVar3 = this->m_r;
    dVar4 = this->m_r;
    dVar2 = Vector3::mod2((Vector3 *)&tca);
    dVar3 = dVar1 * dVar1 + dVar3 * dVar4 + -dVar2;
    if (1e-06 < dVar3) {
      dVar3 = sqrt(dVar3);
      dVar4 = dVar1 - dVar3;
      p.z = dVar1 + dVar3;
      if (1e-06 < dVar4) {
        Vector3::operator*(&local_a8,(Vector3 *)&oc.z,dVar4);
        operator+((Vector3 *)local_90,start,&local_a8);
        operator-((Vector3 *)&p_1.z,(Vector3 *)local_90,&this->m_o);
        Collision::Collision
                  (__return_storage_ptr__,start,(Vector3 *)&oc.z,dVar4,(Vector3 *)&p_1.z,false,
                   &this->super_Object);
        return __return_storage_ptr__;
      }
      if (1e-06 < p.z) {
        Vector3::operator*(&local_f0,(Vector3 *)&oc.z,p.z);
        operator+((Vector3 *)local_d8,start,&local_f0);
        dVar1 = p.z;
        operator-(&local_108,&this->m_o,(Vector3 *)local_d8);
        Collision::Collision
                  (__return_storage_ptr__,start,(Vector3 *)&oc.z,dVar1,&local_108,true,
                   &this->super_Object);
        return __return_storage_ptr__;
      }
    }
  }
  Collision::Collision(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Collision Sphere::collide(const Vector3& start, const Vector3& dir) const
{
    Vector3 d = dir.unitize();
    Vector3 oc = m_o - start;
    double tca = oc.dot(d);
    if (tca > Const::EPS)
    {
        double thc2 = m_r * m_r - oc.mod2() + tca * tca;
        if (thc2 > Const::EPS)
        {
            double thc = sqrt(thc2), t1 = tca - thc, t2 = tca + thc;
            if (t1 > Const::EPS)
            {
                Vector3 p = start + d * t1;
                return Collision(start, d, t1, p - m_o, false, this);
            }
            else if (t2 > Const::EPS)
            {
                Vector3 p = start + d * t2;
                return Collision(start, d, t2, m_o - p, true, this);
            }
        }
    }

    return Collision();
}